

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void CTcPrsOpUnary::capture_embedded(CTcEmbedBuilder *b,CTcEmbedTokenList *tl)

{
  tc_toktyp_t tVar1;
  tc_toktyp_t tVar2;
  CTcTokenizer *this;
  CTcEmbedTokenList *in_RSI;
  long *in_RDI;
  int bracks;
  int parens;
  int braces;
  int iVar3;
  int iVar4;
  
  CTcEmbedTokenList::reset(in_RSI);
  iVar4 = 0;
  iVar3 = 0;
  do {
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x255a3f);
    this = (CTcTokenizer *)(ulong)(tVar1 - TOKT_EOF);
    switch(this) {
    case (CTcTokenizer *)0x0:
      return;
    default:
      tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x255aed);
      tVar2 = (**(code **)(*in_RDI + 0x38))();
      if (tVar1 == tVar2) {
        return;
      }
      tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x255b15);
      tVar2 = (**(code **)(*in_RDI + 0x30))();
      if (tVar1 == tVar2) {
        return;
      }
      break;
    case (CTcTokenizer *)0x11:
      iVar3 = iVar3 + 1;
      break;
    case (CTcTokenizer *)0x12:
      iVar3 = iVar3 + -1;
      break;
    case (CTcTokenizer *)0x15:
      iVar4 = iVar4 + 1;
      break;
    case (CTcTokenizer *)0x16:
      iVar4 = iVar4 + -1;
      if (iVar4 < 0) {
        return;
      }
      break;
    case (CTcTokenizer *)0x17:
      break;
    case (CTcTokenizer *)0x18:
      break;
    case (CTcTokenizer *)0x28:
      if (iVar4 == 0) {
        return;
      }
    }
    CTcTokenizer::getcur(G_tok);
    CTcEmbedTokenList::add_tok(in_RSI,(CTcToken *)CONCAT44(iVar4,iVar3));
    CTcTokenizer::next(this);
  } while( true );
}

Assistant:

void CTcPrsOpUnary::capture_embedded(CTcEmbedBuilder *b, CTcEmbedTokenList *tl)
{
    /* reset the list */
    tl->reset();

    /* we don't have any nested braces or parens yet */
    int braces = 0, parens = 0, bracks = 0;

    /* run through the list */
    for (;;)
    {
        /* check what we have */
        switch (G_tok->cur())
        {
        case TOKT_LBRACE:
            ++braces;
            break;
            
        case TOKT_RBRACE:
            /* 
             *   if we find an unbalanced close brace, assume that we've
             *   reached the end of the statement without properly
             *   terminating the string 
             */
            if (--braces < 0)
                return;
            break;
            
        case TOKT_LPAR:
            ++parens;
            break;
            
        case TOKT_RPAR:
            --parens;
            break;
            
        case TOKT_LBRACK:
            ++bracks;
            break;
            
        case TOKT_RBRACK:
            --bracks;
            break;
            
        case TOKT_SEM:
            /* 
             *   if we find a semicolon outside of braces, assume that we've
             *   reached the end of the statement without properly
             *   terminating the string 
             */
            if (braces == 0)
                return;
            break;
            
        case TOKT_EOF:
            return;
            
        default:
            /* stop if we've reached the next string segment */
            if (G_tok->cur() == b->end_tok()
                || G_tok->cur() == b->mid_tok())
                return;
            break;
        }
        
        /* add the token to the capture list and move on to the next */
        tl->add_tok(G_tok->getcur());
        G_tok->next();
    }
}